

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O0

void lj_lex_cleanup(lua_State *L,LexState *ls)

{
  uint uVar1;
  undefined8 *puVar2;
  BCInsLine *pBVar3;
  VarInfo *pVVar4;
  char *pcVar5;
  ulong uVar6;
  global_State *g;
  LexState *ls_local;
  lua_State *L_local;
  
  puVar2 = (undefined8 *)(L->glref).ptr64;
  pBVar3 = ls->bcstack;
  uVar1 = ls->sizebcstack;
  puVar2[2] = puVar2[2] + (ulong)uVar1 * -8;
  (*(code *)*puVar2)(puVar2[1],pBVar3,(ulong)uVar1 * 8,0);
  pVVar4 = ls->vstack;
  uVar1 = ls->sizevstack;
  puVar2[2] = puVar2[2] + (ulong)uVar1 * -0x18;
  (*(code *)*puVar2)(puVar2[1],pVVar4,(ulong)uVar1 * 0x18,0);
  pcVar5 = (ls->sb).b;
  uVar6 = (ulong)(uint)((int)(ls->sb).e - (int)(ls->sb).b);
  puVar2[2] = puVar2[2] - uVar6;
  (*(code *)*puVar2)(puVar2[1],pcVar5,uVar6,0);
  return;
}

Assistant:

void lj_lex_cleanup(lua_State *L, LexState *ls)
{
  global_State *g = G(L);
  lj_mem_freevec(g, ls->bcstack, ls->sizebcstack, BCInsLine);
  lj_mem_freevec(g, ls->vstack, ls->sizevstack, VarInfo);
  lj_buf_free(g, &ls->sb);
}